

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::TestRecursiveMessage::Clear(TestRecursiveMessage *this)

{
  TestRecursiveMessage *this_00;
  LogMessageFatal LStack_18;
  
  if ((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x1) !=
      (undefined1  [24])0x0) {
    this_00 = (this->field_0)._impl_.a_;
    if (this_00 == (TestRecursiveMessage *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.cc"
                 ,0x5641,"_impl_.a_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    Clear(this_00);
  }
  (this->field_0)._impl_.i_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestRecursiveMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestRecursiveMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.a_ != nullptr);
    _impl_.a_->Clear();
  }
  _impl_.i_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}